

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

void uv__print_handles(uv_loop_t *loop,int only_active,FILE *stream)

{
  uv_handle_t *h;
  QUEUE *q;
  char *type;
  FILE *stream_local;
  uv_loop_t *puStack_10;
  int only_active_local;
  uv_loop_t *loop_local;
  
  puStack_10 = loop;
  if (loop == (uv_loop_t *)0x0) {
    puStack_10 = uv_default_loop();
  }
  for (h = (uv_handle_t *)puStack_10->handle_queue[0]; h != (uv_handle_t *)puStack_10->handle_queue;
      h = (uv_handle_t *)h->data) {
    if ((only_active == 0) ||
       (((undefined1  [32])h->u & (undefined1  [32])0x4) != (undefined1  [32])0x0)) {
      switch(*(undefined4 *)&h[-1].next_closing) {
      case 1:
        q = (QUEUE *)anon_var_dwarf_164d2c1;
        break;
      case 2:
        q = (QUEUE *)0xce5c60;
        break;
      case 3:
        q = (QUEUE *)anon_var_dwarf_164d2d9;
        break;
      case 4:
        q = (QUEUE *)anon_var_dwarf_164d2e5;
        break;
      case 5:
        q = (QUEUE *)0xcdcbea;
        break;
      case 6:
        q = (QUEUE *)0xcab98f;
        break;
      case 7:
        q = (QUEUE *)0xcdb687;
        break;
      case 8:
        q = (QUEUE *)0xca2a19;
        break;
      case 9:
        q = (QUEUE *)anon_var_dwarf_164d32d;
        break;
      case 10:
        q = (QUEUE *)0xc9cac8;
        break;
      case 0xb:
        q = (QUEUE *)0xcca4e5;
        break;
      case 0xc:
        q = (QUEUE *)anon_var_dwarf_164d351;
        break;
      case 0xd:
        q = (QUEUE *)anon_var_dwarf_164d35d;
        break;
      case 0xe:
        q = (QUEUE *)0xc9ddcb;
        break;
      case 0xf:
        q = (QUEUE *)anon_var_dwarf_164d375;
        break;
      case 0x10:
        q = (QUEUE *)anon_var_dwarf_164d381;
        break;
      default:
        q = (QUEUE *)anon_var_dwarf_164d38d;
      }
      fprintf((FILE *)stream,"[%c%c%c] %-8s %p\n",
              (ulong)(uint)(int)"R-"[(int)(uint)((((undefined1  [32])h->u & (undefined1  [32])0x8)
                                                  != (undefined1  [32])0x0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"A-"[(int)(uint)((((undefined1  [32])h->u & (undefined1  [32])0x4)
                                                  != (undefined1  [32])0x0 ^ 0xffU) & 1)],
              (ulong)(uint)(int)"I-"[(int)(uint)((((undefined1  [32])h->u & (undefined1  [32])0x10)
                                                  != (undefined1  [32])0x0 ^ 0xffU) & 1)],q,
              (undefined1 *)((long)&h[-1].u + 0x10));
    }
  }
  return;
}

Assistant:

static void uv__print_handles(uv_loop_t* loop, int only_active, FILE* stream) {
  const char* type;
  QUEUE* q;
  uv_handle_t* h;

  if (loop == NULL)
    loop = uv_default_loop();

  QUEUE_FOREACH(q, &loop->handle_queue) {
    h = QUEUE_DATA(q, uv_handle_t, handle_queue);

    if (only_active && !uv__is_active(h))
      continue;

    switch (h->type) {
#define X(uc, lc) case UV_##uc: type = #lc; break;
      UV_HANDLE_TYPE_MAP(X)
#undef X
      default: type = "<unknown>";
    }

    fprintf(stream,
            "[%c%c%c] %-8s %p\n",
            "R-"[!(h->flags & UV_HANDLE_REF)],
            "A-"[!(h->flags & UV_HANDLE_ACTIVE)],
            "I-"[!(h->flags & UV_HANDLE_INTERNAL)],
            type,
            (void*)h);
  }
}